

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QNetworkAccessManager::sendCustomRequest
          (QNetworkAccessManager *this,QNetworkRequest *request,QByteArray *verb,QByteArray *data)

{
  long lVar1;
  QBuffer *this_00;
  QNetworkReply *pQVar2;
  QNetworkAccessManager *in_RCX;
  long in_FS_OFFSET;
  QNetworkReply *reply;
  QBuffer *buffer;
  OpenModeFlag in_stack_ffffffffffffff9c;
  QIODevice *in_stack_ffffffffffffffb8;
  QByteArray *in_stack_ffffffffffffffc0;
  QBuffer *pQVar3;
  QBuffer *request_00;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  pQVar3 = this_00;
  QBuffer::setData((QByteArray *)this_00);
  request_00 = pQVar3;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,in_stack_ffffffffffffff9c);
  (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,local_c);
  pQVar2 = sendCustomRequest(in_RCX,(QNetworkRequest *)request_00,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8);
  QObject::setParent((QObject *)request_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::sendCustomRequest(const QNetworkRequest &request, const QByteArray &verb, const QByteArray &data)
{
    QBuffer *buffer = new QBuffer;
    buffer->setData(data);
    buffer->open(QIODevice::ReadOnly);

    QNetworkReply *reply = sendCustomRequest(request, verb, buffer);
    buffer->setParent(reply);
    return reply;
}